

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

void Mf_ManDumpCnf(Gia_Man_t *p,char *pFileName,int nLutSize,int fCnfObjIds,int fAddOrCla,
                  int fVerbose)

{
  abctime aVar1;
  Cnf_Dat_t *p_00;
  abctime aVar2;
  Cnf_Dat_t *pCnf;
  abctime clk;
  int fVerbose_local;
  int fAddOrCla_local;
  int fCnfObjIds_local;
  int nLutSize_local;
  char *pFileName_local;
  Gia_Man_t *p_local;
  
  aVar1 = Abc_Clock();
  p_00 = Mf_ManGenerateCnf(p,nLutSize,fCnfObjIds,fAddOrCla,fVerbose);
  Cnf_DataWriteIntoFile(p_00,pFileName,0,(Vec_Int_t *)0x0,(Vec_Int_t *)0x0);
  printf("CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ",(ulong)(uint)p_00->nVars,
         (ulong)(uint)p_00->nClauses,(ulong)(uint)p_00->nLiterals);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  Cnf_DataFree(p_00);
  return;
}

Assistant:

void Mf_ManDumpCnf( Gia_Man_t * p, char * pFileName, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose )
{
    abctime clk = Abc_Clock();
    Cnf_Dat_t * pCnf;
    pCnf = Mf_ManGenerateCnf( p, nLutSize, fCnfObjIds, fAddOrCla, fVerbose );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, NULL, NULL );
//    if ( fVerbose )
    {
        printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Cnf_DataFree(pCnf);
}